

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

double __thiscall
HighsMipSolverData::transformNewIntegerFeasibleSolution
          (HighsMipSolverData *this,vector<double,_std::allocator<double>_> *sol,
          bool possibly_store_as_new_incumbent)

{
  uint uVar1;
  HighsLp *pHVar2;
  HighsCallback *pHVar3;
  double dVar4;
  double dVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  HighsInt HVar9;
  bool bVar10;
  HighsStatus HVar11;
  HighsMipSolver *pHVar12;
  double *integrality_violation;
  undefined7 in_register_00000011;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  HighsOptions *pHVar13;
  HighsInt i;
  ulong uVar14;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Db;
  double dVar17;
  double dVar18;
  reference rVar19;
  HighsCDouble HVar20;
  allocator local_5a35;
  undefined4 local_5a34;
  double integrality_violation_;
  double row_violation_;
  double bound_violation_;
  HighsMipSolver *local_5a18;
  ulong uStack_5a10;
  undefined4 local_59fc;
  HighsCDouble local_59f8;
  double local_59e0;
  HighsMipSolverData *local_59d8;
  double local_59d0;
  string local_59c8;
  string local_59a8;
  HighsSolution solution;
  HighsLp fixedModel;
  HighsLp local_5588;
  Highs tmpSolver;
  
  solution.value_valid = false;
  solution.dual_valid = false;
  solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  solution.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  solution.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  solution.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  solution.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  solution.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  solution.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  solution.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  solution.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  solution.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::operator=(&solution.col_value,sol);
  solution.value_valid = true;
  presolve::HighsPostsolveStack::undoPrimal
            (&this->postSolveStack,this->mipsolver->options_mip_,&solution,-1);
  HVar11 = calculateRowValuesQuad(this->mipsolver->orig_model_,&solution,-1);
  local_59fc = (undefined4)CONCAT71(in_register_00000011,possibly_store_as_new_incumbent);
  local_5a34 = (undefined4)CONCAT71((uint7)(uint3)((uint)HVar11 >> 8),1);
  local_59d8 = this;
  do {
    bound_violation_ = 0.0;
    row_violation_ = 0.0;
    integrality_violation_ = 0.0;
    local_59f8.hi = 0.0;
    local_59f8.lo = 0.0;
    integrality_violation = &integrality_violation_;
    bVar10 = HighsMipSolver::solutionFeasible
                       (this->mipsolver,this->mipsolver->orig_model_,&solution.col_value,
                        &solution.row_value,&bound_violation_,&row_violation_,integrality_violation,
                        &local_59f8);
    dVar5 = local_59f8.hi;
    dVar18 = local_59f8.lo;
    if ((~(byte)local_5a34 & 1) != 0 || bVar10) goto LAB_002c326d;
    local_59e0 = local_59f8.lo;
    HighsLp::HighsLp(&fixedModel,this->mipsolver->orig_model_);
    pdVar8 = fixedModel.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = fixedModel.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (fixedModel.integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        fixedModel.integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      fixedModel.integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           fixedModel.integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    local_5a18 = this->mipsolver;
    pHVar2 = local_5a18->orig_model_;
    uVar1 = pHVar2->num_col_;
    __buf = extraout_RDX;
    for (uVar14 = 0; this = local_59d8, uVar1 != uVar14; uVar14 = uVar14 + 1) {
      if ((pHVar2->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar14] == kInteger) {
        dVar4 = round(pdVar6[uVar14]);
        uVar15 = SUB84(dVar4,0);
        uVar16 = (undefined4)((ulong)dVar4 >> 0x20);
        dVar18 = pdVar7[uVar14];
        dVar17 = dVar4;
        if (dVar4 <= dVar18) {
          dVar17 = dVar18;
        }
        pdVar7[uVar14] = dVar17;
        dVar18 = pdVar8[uVar14];
        if (dVar18 <= dVar4) {
          uVar15 = SUB84(dVar18,0);
          uVar16 = (undefined4)((ulong)dVar18 >> 0x20);
        }
        pdVar8[uVar14] = (double)CONCAT44(uVar16,uVar15);
        __buf = extraout_RDX_00;
      }
    }
    local_59d8->total_repair_lp = local_59d8->total_repair_lp + 1;
    local_59d0 = (local_5a18->options_mip_->super_HighsOptionsStruct).time_limit;
    HighsTimer::read(&local_5a18->timer_,0,__buf,(size_t)integrality_violation);
    local_5a18 = (HighsMipSolver *)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    Highs::Highs(&tmpSolver);
    std::__cxx11::string::string((string *)&local_59c8,"output_flag",&local_5a35);
    Highs::setOptionValue(&tmpSolver,&local_59c8,false);
    std::__cxx11::string::~string((string *)&local_59c8);
    std::__cxx11::string::string((string *)&local_59c8,"time_limit",&local_5a35);
    dVar18 = 0.1;
    if (0.1 <= local_59d0 - (double)local_5a18) {
      dVar18 = local_59d0 - (double)local_5a18;
    }
    Highs::setOptionValue(&tmpSolver,&local_59c8,dVar18);
    std::__cxx11::string::~string((string *)&local_59c8);
    std::__cxx11::string::string((string *)&local_59c8,"primal_feasibility_tolerance",&local_5a35);
    Highs::setOptionValue
              (&tmpSolver,&local_59c8,
               (this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_feasibility_tolerance);
    std::__cxx11::string::~string((string *)&local_59c8);
    if ((this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_root_presolve_only == true) {
      std::__cxx11::string::string((string *)&local_59c8,"presolve",&local_5a35);
      Highs::setOptionValue(&tmpSolver,&local_59c8,&::kHighsOffString_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_59c8);
    }
    HighsLp::HighsLp(&local_5588,&fixedModel);
    Highs::passModel(&tmpSolver,&local_5588);
    HighsLp::~HighsLp(&local_5588);
    HighsMipAnalysis::mipTimerStart(&this->mipsolver->analysis_,0x3a);
    Highs::run(&tmpSolver);
    HighsMipAnalysis::mipTimerStop(&this->mipsolver->analysis_,0x3a);
    HVar9 = tmpSolver.info_.super_HighsInfoStruct.primal_solution_status;
    this->total_repair_lp_iterations =
         (long)tmpSolver.info_.super_HighsInfoStruct.simplex_iteration_count;
    if (tmpSolver.info_.super_HighsInfoStruct.primal_solution_status == 2) {
      this->total_repair_lp_feasible = this->total_repair_lp_feasible + 1;
      HighsSolution::operator=(&solution,&tmpSolver.solution_);
      local_5a34 = 0;
    }
    Highs::~Highs(&tmpSolver);
    HighsLp::~HighsLp(&fixedModel);
  } while (HVar9 == 2);
  bVar10 = false;
  dVar18 = local_59e0;
LAB_002c326d:
  uVar14 = 0;
  dVar5 = dVar5 + dVar18;
  if ((((bVar10 != false) && (this->mipsolver->submip == false)) &&
      (pHVar3 = this->mipsolver->callback_,
      (pHVar3->user_callback).super__Function_base._M_manager != (_Manager_type)0x0)) &&
     (rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[](&pHVar3->active,3),
     (*rVar19._M_p & rVar19._M_mask) != 0)) {
    HighsCallback::clearHighsCallbackDataOut(this->mipsolver->callback_);
    (this->mipsolver->callback_->data_out).mip_solution =
         solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&local_59a8,"Feasible solution",(allocator *)&tmpSolver);
    interruptFromCallbackWithData(this,3,dVar5,&local_59a8);
    std::__cxx11::string::~string((string *)&local_59a8);
  }
  if ((char)local_59fc == '\0') {
    pHVar12 = this->mipsolver;
  }
  else {
    if (bVar10 == false) {
      pHVar12 = this->mipsolver;
      if (INFINITY <= pHVar12->solution_objective_) {
        pHVar13 = pHVar12->options_mip_;
LAB_002c3400:
        bVar10 = false;
      }
      else {
        pHVar13 = pHVar12->options_mip_;
        dVar18 = (pHVar13->super_HighsOptionsStruct).mip_feasibility_tolerance;
        if ((dVar18 < pHVar12->bound_violation_) || (dVar18 < pHVar12->integrality_violation_))
        goto LAB_002c3400;
        bVar10 = pHVar12->row_violation_ <= dVar18;
      }
      highsLogUser(&(pHVar13->super_HighsOptionsStruct).log_options,kWarning,
                   "Solution with objective %g has untransformed violations: bound = %.4g; integrality = %.4g; row = %.4g\n"
                   ,SUB84(dVar5,0),bound_violation_,integrality_violation_,row_violation_);
      if (!bVar10) {
        pHVar12 = this->mipsolver;
        pHVar12->row_violation_ = row_violation_;
        pHVar12->bound_violation_ = bound_violation_;
        pHVar12->integrality_violation_ = integrality_violation_;
        std::vector<double,_std::allocator<double>_>::_M_move_assign
                  (&pHVar12->solution_,&solution.col_value);
        this->mipsolver->solution_objective_ = dVar5;
      }
      local_5a18 = (HighsMipSolver *)0x7ff0000000000000;
      uStack_5a10 = 0;
      goto LAB_002c3482;
    }
    pHVar12 = this->mipsolver;
    pHVar12->row_violation_ = row_violation_;
    pHVar12->bound_violation_ = bound_violation_;
    uVar14 = 0;
    pHVar12->integrality_violation_ = integrality_violation_;
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              (&pHVar12->solution_,&solution.col_value);
    pHVar12 = this->mipsolver;
    pHVar12->solution_objective_ = dVar5;
  }
  dVar5 = pHVar12->model_->offset_;
  if (pHVar12->orig_model_->sense_ == kMaximize) {
    HVar20 = HighsCDouble::operator+(&local_59f8,dVar5);
    local_5a18 = (HighsMipSolver *)-(HVar20.lo + HVar20.hi);
    uStack_5a10 = uVar14 ^ 0x8000000000000000;
  }
  else {
    HVar20 = HighsCDouble::operator-(&local_59f8,dVar5);
    local_5a18 = (HighsMipSolver *)(HVar20.lo + HVar20.hi);
    uStack_5a10 = uVar14;
  }
LAB_002c3482:
  HighsSolution::~HighsSolution(&solution);
  return (double)local_5a18;
}

Assistant:

double HighsMipSolverData::transformNewIntegerFeasibleSolution(
    const std::vector<double>& sol,
    const bool possibly_store_as_new_incumbent) {
  HighsSolution solution;
  solution.col_value = sol;
  solution.value_valid = true;
  // Perform primal postsolve to get the original column values
  postSolveStack.undoPrimal(*mipsolver.options_mip_, solution);
  // Determine the row values, as they aren't computed in primal
  // postsolve
  HighsStatus return_status =
      calculateRowValuesQuad(*mipsolver.orig_model_, solution);
  if (kAllowDeveloperAssert) assert(return_status == HighsStatus::kOk);
  bool allow_try_again = true;
try_again:

  // compute the objective value in the original space
  double bound_violation_ = 0;
  double row_violation_ = 0;
  double integrality_violation_ = 0;
  HighsCDouble mipsolver_quad_objective_value = 0;
  bool feasible = mipsolver.solutionFeasible(
      mipsolver.orig_model_, solution.col_value, &solution.row_value,
      bound_violation_, row_violation_, integrality_violation_,
      mipsolver_quad_objective_value);
  double mipsolver_objective_value = double(mipsolver_quad_objective_value);
  if (!feasible && allow_try_again) {
    // printf(
    //     "trying to repair sol that is violated by %.12g bounds, %.12g "
    //     "integrality, %.12g rows\n",
    //     bound_violation_, integrality_violation_, row_violation_);
    HighsLp fixedModel = *mipsolver.orig_model_;
    fixedModel.integrality_.clear();
    for (HighsInt i = 0; i != mipsolver.orig_model_->num_col_; ++i) {
      if (mipsolver.orig_model_->integrality_[i] == HighsVarType::kInteger) {
        double solval = std::round(solution.col_value[i]);
        fixedModel.col_lower_[i] = std::max(fixedModel.col_lower_[i], solval);
        fixedModel.col_upper_[i] = std::min(fixedModel.col_upper_[i], solval);
      }
    }
    this->total_repair_lp++;
    double time_available = std::max(
        mipsolver.options_mip_->time_limit - mipsolver.timer_.read(), 0.1);
    Highs tmpSolver;
    const bool debug_report = false;
    if (debug_report) {
      tmpSolver.setOptionValue("log_dev_level", 2);
      tmpSolver.setOptionValue("highs_analysis_level", 4);
    } else {
      tmpSolver.setOptionValue("output_flag", false);
    }
    // tmpSolver.setOptionValue("simplex_scale_strategy", 0);
    // tmpSolver.setOptionValue("presolve", kHighsOffString);
    tmpSolver.setOptionValue("time_limit", time_available);
    tmpSolver.setOptionValue("primal_feasibility_tolerance",
                             mipsolver.options_mip_->mip_feasibility_tolerance);
    // check if only root presolve is allowed
    if (mipsolver.options_mip_->mip_root_presolve_only)
      tmpSolver.setOptionValue("presolve", kHighsOffString);
    tmpSolver.passModel(std::move(fixedModel));
    mipsolver.analysis_.mipTimerStart(kMipClockSimplexNoBasisSolveLp);
    tmpSolver.run();
    mipsolver.analysis_.mipTimerStop(kMipClockSimplexNoBasisSolveLp);

    this->total_repair_lp_iterations =
        tmpSolver.getInfo().simplex_iteration_count;
    if (tmpSolver.getInfo().primal_solution_status == kSolutionStatusFeasible) {
      this->total_repair_lp_feasible++;
      solution = tmpSolver.getSolution();
      allow_try_again = false;
      goto try_again;
    }
  }

  // Possible MIP solution callback
  if (!mipsolver.submip && feasible && mipsolver.callback_->user_callback &&
      mipsolver.callback_->active[kCallbackMipSolution]) {
    mipsolver.callback_->clearHighsCallbackDataOut();
    mipsolver.callback_->data_out.mip_solution = solution.col_value.data();
    const bool interrupt = interruptFromCallbackWithData(
        kCallbackMipSolution, mipsolver_objective_value, "Feasible solution");
    assert(!interrupt);
  }

  if (possibly_store_as_new_incumbent) {
    // Store the solution as incumbent in the original space if there
    // is no solution or if it is feasible
    if (feasible) {
      // if (!allow_try_again)
      //   printf("repaired solution with value %g\n",
      //   mipsolver_objective_value);
      // store
      mipsolver.row_violation_ = row_violation_;
      mipsolver.bound_violation_ = bound_violation_;
      mipsolver.integrality_violation_ = integrality_violation_;
      mipsolver.solution_ = std::move(solution.col_value);
      mipsolver.solution_objective_ = mipsolver_objective_value;
    } else {
      bool currentFeasible =
          mipsolver.solution_objective_ != kHighsInf &&
          mipsolver.bound_violation_ <=
              mipsolver.options_mip_->mip_feasibility_tolerance &&
          mipsolver.integrality_violation_ <=
              mipsolver.options_mip_->mip_feasibility_tolerance &&
          mipsolver.row_violation_ <=
              mipsolver.options_mip_->mip_feasibility_tolerance;
      highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kWarning,
                   "Solution with objective %g has untransformed violations: "
                   "bound = %.4g; integrality = %.4g; row = %.4g\n",
                   mipsolver_objective_value, bound_violation_,
                   integrality_violation_, row_violation_);
      if (!currentFeasible) {
        // if the current incumbent is non existent or also not feasible we
        // still store the new one
        mipsolver.row_violation_ = row_violation_;
        mipsolver.bound_violation_ = bound_violation_;
        mipsolver.integrality_violation_ = integrality_violation_;
        mipsolver.solution_ = std::move(solution.col_value);
        mipsolver.solution_objective_ = mipsolver_objective_value;
      }

      // return infinity so that it is not used for bounding
      return kHighsInf;
    }
  }
  // return the objective value in the transformed space
  if (mipsolver.orig_model_->sense_ == ObjSense::kMaximize)
    return -double(mipsolver_quad_objective_value + mipsolver.model_->offset_);

  return double(mipsolver_quad_objective_value - mipsolver.model_->offset_);
}